

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise_x86::forward
          (DeconvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int *piVar5;
  void *pvVar6;
  size_t sVar7;
  void *pvVar8;
  Layer *pLVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Mat *pMVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  _func_int *p_Var27;
  _func_int **pp_Var28;
  int iVar29;
  int iVar30;
  long lVar31;
  float *pfVar32;
  _func_int *p_Var33;
  long lVar34;
  uint uVar35;
  uint _elempack;
  ulong uVar36;
  int iVar37;
  int iVar38;
  undefined1 (*pauVar39) [16];
  float _h;
  size_t sVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  v4sf one;
  float fVar48;
  float fVar49;
  float fVar56;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  int local_2b0;
  void *local_2a8;
  ulong local_260;
  ulong local_240;
  Mat local_238;
  Mat local_1e8;
  Mat *local_198;
  size_t local_190;
  _func_int **local_188;
  Mat local_180;
  float local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  long local_120;
  void *local_118;
  void *local_110;
  void *local_108;
  int *local_100;
  ulong local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  ulong local_c8;
  void *local_c0;
  int *local_b8;
  ulong local_b0;
  int local_a8;
  Allocator *local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  iVar43 = bottom_blob->w;
  iVar44 = bottom_blob->h;
  uVar36 = bottom_blob->elemsize;
  iVar4 = bottom_blob->elempack;
  p_Var27 = this->_vptr_DeconvolutionDepthWise_x86[-3];
  uVar35 = 1;
  if (opt->use_packing_layout == true) {
    uVar35 = (uint)(((&this->field_0xd0)[(long)p_Var27] & 3) == 0) * 3 + 1;
  }
  iVar21 = *(int *)(&this->field_0xd4 + (long)p_Var27);
  iVar42 = *(int *)(&this->field_0xdc + (long)p_Var27);
  iVar37 = *(int *)(&this->field_0xe4 + (long)p_Var27);
  iVar29 = (*(int *)(&this->field_0xd8 + (long)p_Var27) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var27);
  iVar20 = *(int *)(&this->field_0xe8 + (long)p_Var27);
  iVar30 = *(int *)(&this->field_0xfc + (long)p_Var27);
  iVar38 = *(int *)(&this->field_0x100 + (long)p_Var27);
  uVar25 = bottom_blob->c;
  local_238.cstep = 0;
  local_238.data = (void *)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize._0_4_ = 0;
  local_238.elemsize._4_4_ = 0;
  local_238.elempack = 0;
  local_238.allocator = (Allocator *)0x0;
  local_238.dims = 0;
  local_238.w = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238.c = 0;
  p_Var33 = this->_vptr_DeconvolutionDepthWise_x86[-3];
  p_Var27 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86 + (long)p_Var33);
  lVar31 = 0x10;
  if (((((*(int *)(&this->field_0xec + (long)p_Var33) < 1) && (*(int *)(p_Var27 + 0xf0) < 1)) &&
       (*(int *)(p_Var27 + 0xf4) < 1)) && (*(int *)(p_Var27 + 0xf8) < 1)) &&
     ((*(int *)(p_Var27 + 0x104) < 1 || (*(int *)(p_Var27 + 0x108) < 1)))) {
    if (&local_238 != top_blob) {
      piVar5 = top_blob->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      local_238.data = top_blob->data;
      local_238.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_238.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_238.elemsize._0_4_ = (undefined4)top_blob->elemsize;
      local_238.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
      local_238.elempack = top_blob->elempack;
      local_238.allocator = top_blob->allocator;
      uVar12 = top_blob->dims;
      uVar13 = top_blob->w;
      uVar14 = top_blob->h;
      uVar15 = top_blob->d;
      local_238.c = top_blob->c;
      local_238.cstep = top_blob->cstep;
      p_Var33 = this->_vptr_DeconvolutionDepthWise_x86[-3];
      local_238.dims = uVar12;
      local_238.w = uVar13;
      local_238.h = uVar14;
      local_238.d = uVar15;
    }
    p_Var27 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86 + (long)p_Var33);
    lVar31 = 8;
  }
  iVar42 = (iVar21 + -1) * iVar42;
  iVar37 = iVar30 + (iVar43 + -1) * iVar37 + iVar42 + 1;
  _h = (float)(iVar38 + (iVar44 + -1) * iVar20 + iVar29 + 1);
  sVar40 = (uVar36 / (ulong)(long)iVar4) * (ulong)uVar35;
  local_198 = top_blob;
  Mat::create(&local_238,iVar37,(int)_h,*(int *)(p_Var27 + 0xd0) / (int)uVar35,sVar40,uVar35,
              *(Allocator **)(&opt->lightmode + lVar31));
  auVar18 = _DAT_00512e60;
  auVar17 = _DAT_00512e30;
  auVar16 = _DAT_00512e20;
  iVar21 = -100;
  if ((local_238.data == (void *)0x0) ||
     (local_190 = local_238.cstep, (long)local_238.c * local_238.cstep == 0)) goto LAB_0045ba99;
  p_Var27 = this->_vptr_DeconvolutionDepthWise_x86[-3];
  iVar20 = iVar4 * uVar25;
  iVar21 = *(int *)(&this->field_0x114 + (long)p_Var27);
  if ((iVar20 == iVar21) && (iVar20 == *(int *)(&this->field_0xd0 + (long)p_Var27))) {
    iVar21 = *(int *)(&this->field_0xd8 + (long)p_Var27) *
             *(int *)(&this->field_0xd4 + (long)p_Var27);
    if (iVar4 == 1) {
      local_110 = local_238.data;
      if (0 < (int)uVar25) {
        local_190 = local_238.cstep *
                    CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
        local_2a8 = (this->weight_data_tm).data;
        iVar4 = bottom_blob->w;
        local_118 = bottom_blob->data;
        sVar40 = bottom_blob->elemsize;
        local_120 = bottom_blob->cstep * sVar40;
        local_260 = 0;
        do {
          pvVar6 = local_118;
          if (0 < (int)_h) {
            lVar31 = local_120 * local_260;
            pfVar32 = (float *)(local_190 * local_260 + (long)local_110);
            local_188 = this->_vptr_DeconvolutionDepthWise_x86;
            fVar45 = 0.0;
            do {
              if (0 < iVar37) {
                iVar20 = 0;
                local_2b0 = -iVar42;
                do {
                  p_Var27 = local_188[-3];
                  if (*(int *)(&this->field_0x10c + (long)p_Var27) == 0) {
                    fVar46 = 0.0;
                  }
                  else {
                    fVar46 = *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var27) +
                                       local_260 * 4);
                  }
                  if (0 < *(int *)(&this->field_0xd8 + (long)p_Var27)) {
                    iVar30 = 0;
                    do {
                      iVar38 = *(int *)(&this->field_0xe0 + (long)p_Var27) * iVar30 +
                               ((int)fVar45 - iVar29);
                      if (((-1 < iVar38) &&
                          (iVar41 = iVar38 / *(int *)(&this->field_0xe8 + (long)p_Var27),
                          iVar38 % *(int *)(&this->field_0xe8 + (long)p_Var27) == 0)) &&
                         (iVar41 < iVar44)) {
                        iVar38 = *(int *)(&this->field_0xd4 + (long)p_Var27);
                        if (0 < (long)iVar38) {
                          lVar34 = 0;
                          iVar22 = local_2b0;
                          do {
                            if (((-1 < iVar22) &&
                                (iVar23 = iVar22 / *(int *)(&this->field_0xe4 + (long)p_Var27),
                                iVar22 % *(int *)(&this->field_0xe4 + (long)p_Var27) == 0)) &&
                               (iVar23 < iVar43)) {
                              fVar46 = fVar46 + *(float *)((long)local_2a8 +
                                                          lVar34 * 4 +
                                                          (ulong)(uint)(iVar38 * iVar30) * 4) *
                                                *(float *)((long)pvVar6 +
                                                          (long)iVar23 * 4 +
                                                          (long)iVar41 * (long)iVar4 * sVar40 +
                                                          lVar31);
                            }
                            lVar34 = lVar34 + 1;
                            iVar22 = iVar22 + *(int *)(&this->field_0xdc + (long)p_Var27);
                          } while (iVar38 != lVar34);
                        }
                      }
                      iVar30 = iVar30 + 1;
                    } while (iVar30 != *(int *)(&this->field_0xd8 + (long)p_Var27));
                  }
                  fVar47 = fVar46;
                  switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var27)) {
                  case 1:
                    if (fVar46 <= 0.0) {
                      fVar47 = 0.0;
                    }
                    break;
                  case 2:
                    fVar47 = (float)(-(uint)(0.0 < fVar46) & 0x3f800000 |
                                    ~-(uint)(0.0 < fVar46) &
                                    **(uint **)(&this->field_0x120 + (long)p_Var27)) * fVar46;
                    break;
                  case 3:
                    fVar47 = **(float **)(&this->field_0x120 + (long)p_Var27);
                    if (fVar46 <= fVar47) {
                      fVar46 = fVar47;
                    }
                    fVar48 = (*(float **)(&this->field_0x120 + (long)p_Var27))[1];
                    fVar47 = fVar46;
                    if (fVar48 < fVar46) {
LAB_0045b896:
                      fVar47 = fVar48;
                    }
                    break;
                  case 4:
                    if (88.37626 <= fVar46) {
                      fVar46 = 88.37626;
                    }
                    fVar46 = expf((float)(-(uint)(fVar46 < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(fVar46 < -88.37626) & (uint)-fVar46));
                    fVar47 = 1.0 / (fVar46 + 1.0);
                    break;
                  case 5:
                    uStack_134 = 0;
                    uStack_130 = 0;
                    uStack_12c = 0;
                    local_138 = fVar46;
                    fVar46 = expf(fVar46);
                    fVar46 = logf(fVar46 + 1.0);
                    fVar46 = tanhf(fVar46);
                    fVar47 = fVar46 * local_138;
                    break;
                  case 6:
                    fVar48 = **(float **)(&this->field_0x120 + (long)p_Var27);
                    fVar49 = (*(float **)(&this->field_0x120 + (long)p_Var27))[1];
                    fVar59 = -fVar49 / fVar48;
                    fVar47 = 0.0;
                    if ((fVar59 <= fVar46) && (fVar47 = fVar46, fVar46 <= fVar59 + 1.0 / fVar48)) {
                      fVar48 = (fVar48 * fVar46 + fVar49) * fVar46;
                      goto LAB_0045b896;
                    }
                  }
                  *pfVar32 = fVar47;
                  pfVar32 = pfVar32 + 1;
                  iVar20 = iVar20 + 1;
                  local_2b0 = local_2b0 + 1;
                } while (iVar20 != iVar37);
              }
              fVar45 = (float)((int)fVar45 + 1);
            } while (fVar45 != _h);
          }
          local_260 = local_260 + 1;
          local_2a8 = (void *)((long)local_2a8 + (long)iVar21 * 4);
        } while (local_260 != uVar25);
      }
    }
    else if ((iVar4 == 4) && (0 < (int)uVar25)) {
      local_240 = 0;
      fVar45 = (float)DAT_00512e60;
      fVar46 = DAT_00512e60._4_4_;
      fVar47 = DAT_00512e60._8_4_;
      fVar48 = DAT_00512e60._12_4_;
      do {
        if (0 < (int)_h) {
          pvVar6 = (this->weight_data_tm).data;
          sVar40 = bottom_blob->cstep;
          sVar7 = bottom_blob->elemsize;
          pvVar8 = bottom_blob->data;
          iVar4 = bottom_blob->w;
          pauVar39 = (undefined1 (*) [16])
                     (local_238.cstep * local_240 *
                      CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize) +
                     (long)local_238.data);
          local_188 = this->_vptr_DeconvolutionDepthWise_x86;
          fVar49 = 0.0;
          do {
            local_138 = fVar49;
            if (0 < iVar37) {
              iVar30 = 0;
              iVar20 = -iVar42;
              do {
                auVar55 = ZEXT816(0);
                p_Var27 = local_188[-3];
                if (*(int *)(&this->field_0x10c + (long)p_Var27) == 0) {
                  auVar69 = ZEXT816(0);
                }
                else {
                  auVar69 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0x1b0 + (long)p_Var27) + local_240 * 0x10);
                }
                if (0 < *(int *)(&this->field_0xd8 + (long)p_Var27)) {
                  iVar41 = 0;
                  iVar38 = 0;
                  do {
                    iVar22 = *(int *)(&this->field_0xe0 + (long)p_Var27) * iVar38 +
                             ((int)local_138 - iVar29);
                    if (((-1 < iVar22) &&
                        (iVar23 = iVar22 / *(int *)(&this->field_0xe8 + (long)p_Var27),
                        iVar22 % *(int *)(&this->field_0xe8 + (long)p_Var27) == 0)) &&
                       (iVar23 < iVar44)) {
                      lVar31 = (long)*(int *)(&this->field_0xd4 + (long)p_Var27);
                      if (0 < lVar31) {
                        uVar35 = *(int *)(&this->field_0xd4 + (long)p_Var27) * iVar41;
                        auVar54 = auVar69;
                        iVar22 = iVar20;
                        do {
                          auVar69 = auVar54;
                          if (((-1 < iVar22) &&
                              (iVar24 = iVar22 / *(int *)(&this->field_0xe4 + (long)p_Var27),
                              iVar22 % *(int *)(&this->field_0xe4 + (long)p_Var27) == 0)) &&
                             (iVar24 < iVar43)) {
                            auVar3 = *(undefined1 (*) [16])
                                      ((long)pvVar8 +
                                      (long)(iVar24 << 2) * 4 +
                                      (long)iVar23 * (long)iVar4 * sVar7 +
                                      sVar40 * local_240 * sVar7);
                            pfVar32 = (float *)((long)pvVar6 +
                                               (ulong)uVar35 * 4 +
                                               (long)(iVar21 * 4 * (int)local_240) * 4);
                            auVar69._0_4_ = auVar54._0_4_ + *pfVar32 * auVar3._0_4_;
                            auVar69._4_4_ = auVar54._4_4_ + pfVar32[1] * auVar3._4_4_;
                            auVar69._8_4_ = auVar54._8_4_ + pfVar32[2] * auVar3._8_4_;
                            auVar69._12_4_ = auVar54._12_4_ + pfVar32[3] * auVar3._12_4_;
                          }
                          uVar35 = uVar35 + 4;
                          iVar22 = iVar22 + *(int *)(&this->field_0xdc + (long)p_Var27);
                          lVar31 = lVar31 + -1;
                          auVar54 = auVar69;
                        } while (lVar31 != 0);
                      }
                    }
                    iVar38 = iVar38 + 1;
                    iVar41 = iVar41 + 4;
                  } while (iVar38 != *(int *)(&this->field_0xd8 + (long)p_Var27));
                }
                fVar49 = auVar69._0_4_;
                fVar59 = auVar69._4_4_;
                fVar56 = auVar69._8_4_;
                fVar61 = auVar69._12_4_;
                switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var27)) {
                case 1:
                  auVar69 = maxps(auVar69,auVar55);
                  break;
                case 2:
                  auVar54 = maxps(auVar69,auVar55);
                  auVar55 = minps(auVar69,auVar55);
                  fVar49 = **(float **)(&this->field_0x120 + (long)p_Var27);
                  auVar69._4_4_ = fVar49 * auVar55._4_4_ + auVar54._4_4_;
                  auVar69._0_4_ = fVar49 * auVar55._0_4_ + auVar54._0_4_;
                  auVar69._8_4_ = fVar49 * auVar55._8_4_ + auVar54._8_4_;
                  auVar69._12_4_ = fVar49 * auVar55._12_4_ + auVar54._12_4_;
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var27);
                  uVar2 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var27))[1];
                  auVar52._4_4_ = uVar1;
                  auVar52._0_4_ = uVar1;
                  auVar52._8_4_ = uVar1;
                  auVar52._12_4_ = uVar1;
                  auVar55 = maxps(auVar69,auVar52);
                  auVar11._4_4_ = uVar2;
                  auVar11._0_4_ = uVar2;
                  auVar11._8_4_ = uVar2;
                  auVar11._12_4_ = uVar2;
                  auVar69 = minps(auVar55,auVar11);
                  break;
                case 4:
                  auVar57._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
                  auVar57._8_4_ = -fVar56;
                  auVar57._12_4_ = -fVar61;
                  auVar55 = minps(auVar57,auVar16);
                  auVar55 = maxps(auVar55,auVar17);
                  fVar59 = auVar55._0_4_ * 1.442695 + 0.5;
                  fVar61 = auVar55._4_4_ * 1.442695 + 0.5;
                  fVar65 = auVar55._8_4_ * 1.442695 + 0.5;
                  fVar67 = auVar55._12_4_ * 1.442695 + 0.5;
                  fVar49 = (float)(int)fVar59;
                  fVar56 = (float)(int)fVar61;
                  fVar64 = (float)(int)fVar65;
                  fVar66 = (float)(int)fVar67;
                  fVar49 = fVar49 - (float)(-(uint)(fVar59 < fVar49) & (uint)fVar45);
                  fVar56 = fVar56 - (float)(-(uint)(fVar61 < fVar56) & (uint)fVar46);
                  fVar64 = fVar64 - (float)(-(uint)(fVar65 < fVar64) & (uint)fVar47);
                  fVar66 = fVar66 - (float)(-(uint)(fVar67 < fVar66) & (uint)fVar48);
                  fVar59 = fVar49 * -0.6931472 + auVar55._0_4_;
                  fVar61 = fVar56 * -0.6931472 + auVar55._4_4_;
                  fVar65 = fVar64 * -0.6931472 + auVar55._8_4_;
                  fVar67 = fVar66 * -0.6931472 + auVar55._12_4_;
                  auVar53._0_4_ =
                       fVar59 + fVar45 +
                       (((((fVar59 * 0.00019875691 + 0.0013981999) * fVar59 + 0.008333452) * fVar59
                         + 0.041665796) * fVar59 + 0.16666666) * fVar59 + 0.5) * fVar59 * fVar59;
                  auVar53._4_4_ =
                       fVar61 + fVar46 +
                       (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) * fVar61
                         + 0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5) * fVar61 * fVar61;
                  auVar53._8_4_ =
                       fVar65 + fVar47 +
                       (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) * fVar65
                         + 0.041665796) * fVar65 + 0.16666666) * fVar65 + 0.5) * fVar65 * fVar65;
                  auVar53._12_4_ =
                       fVar67 + fVar48 +
                       (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67
                         + 0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67;
                  fVar65 = (float)((int)fVar49 * 0x800000 + (int)fVar45) * auVar53._0_4_ + fVar45;
                  fVar67 = (float)((int)fVar56 * 0x800000 + (int)fVar46) * auVar53._4_4_ + fVar46;
                  fVar64 = (float)((int)fVar64 * 0x800000 + (int)fVar47) * auVar53._8_4_ + fVar47;
                  fVar66 = (float)((int)fVar66 * 0x800000 + (int)fVar48) * auVar53._12_4_ + fVar48;
                  auVar10._4_4_ = fVar67;
                  auVar10._0_4_ = fVar65;
                  auVar10._8_4_ = fVar64;
                  auVar10._12_4_ = fVar66;
                  auVar55 = rcpps(auVar53,auVar10);
                  fVar49 = auVar55._0_4_;
                  fVar59 = auVar55._4_4_;
                  fVar56 = auVar55._8_4_;
                  fVar61 = auVar55._12_4_;
                  auVar69._0_4_ = (fVar45 - fVar65 * fVar49) * fVar49 + fVar49;
                  auVar69._4_4_ = (fVar46 - fVar67 * fVar59) * fVar59 + fVar59;
                  auVar69._8_4_ = (fVar47 - fVar64 * fVar56) * fVar56 + fVar56;
                  auVar69._12_4_ = (fVar48 - fVar66 * fVar61) * fVar61 + fVar61;
                  break;
                case 5:
                  auVar55 = minps(auVar69,auVar16);
                  auVar55 = maxps(auVar55,auVar17);
                  fVar64 = auVar55._0_4_ * 1.442695 + 0.5;
                  fVar65 = auVar55._4_4_ * 1.442695 + 0.5;
                  fVar66 = auVar55._8_4_ * 1.442695 + 0.5;
                  fVar67 = auVar55._12_4_ * 1.442695 + 0.5;
                  fVar58 = (float)(int)fVar64;
                  fVar60 = (float)(int)fVar65;
                  fVar62 = (float)(int)fVar66;
                  fVar63 = (float)(int)fVar67;
                  fVar58 = fVar58 - (float)(-(uint)(fVar64 < fVar58) & (uint)fVar45);
                  fVar60 = fVar60 - (float)(-(uint)(fVar65 < fVar60) & (uint)fVar46);
                  fVar62 = fVar62 - (float)(-(uint)(fVar66 < fVar62) & (uint)fVar47);
                  fVar63 = fVar63 - (float)(-(uint)(fVar67 < fVar63) & (uint)fVar48);
                  fVar64 = auVar55._0_4_ - fVar58 * 0.6931472;
                  fVar65 = auVar55._4_4_ - fVar60 * 0.6931472;
                  fVar66 = auVar55._8_4_ - fVar62 * 0.6931472;
                  fVar67 = auVar55._12_4_ - fVar63 * 0.6931472;
                  auVar68._0_4_ =
                       (float)((int)fVar58 * 0x800000 + (int)fVar45) *
                       (fVar64 + fVar45 +
                       (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) * fVar64
                         + 0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) * fVar64 * fVar64) +
                       fVar45;
                  auVar68._4_4_ =
                       (float)((int)fVar60 * 0x800000 + (int)fVar46) *
                       (fVar65 + fVar46 +
                       (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) * fVar65
                         + 0.041665796) * fVar65 + 0.16666666) * fVar65 + 0.5) * fVar65 * fVar65) +
                       fVar46;
                  auVar68._8_4_ =
                       (float)((int)fVar62 * 0x800000 + (int)fVar47) *
                       (fVar66 + fVar47 +
                       (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66
                         + 0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * fVar66 * fVar66) +
                       fVar47;
                  auVar68._12_4_ =
                       (float)((int)fVar63 * 0x800000 + (int)fVar48) *
                       (fVar67 + fVar48 +
                       (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67
                         + 0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67) +
                       fVar48;
                  auVar69 = maxps(auVar68,_DAT_00512ed0);
                  fVar64 = (float)(auVar69._0_4_ & 0x807fffff | 0x3f000000);
                  fVar66 = (float)(auVar69._4_4_ & 0x807fffff | 0x3f000000);
                  fVar58 = (float)(auVar69._8_4_ & 0x807fffff | 0x3f000000);
                  fVar62 = (float)(auVar69._12_4_ & 0x807fffff | 0x3f000000);
                  fVar65 = fVar64 + -1.0 + (float)(-(uint)(fVar64 < 0.70710677) & (uint)fVar64);
                  fVar67 = fVar66 + -1.0 + (float)(-(uint)(fVar66 < 0.70710677) & (uint)fVar66);
                  fVar60 = fVar58 + -1.0 + (float)(-(uint)(fVar58 < 0.70710677) & (uint)fVar58);
                  fVar63 = fVar62 + -1.0 + (float)(-(uint)(fVar62 < 0.70710677) & (uint)fVar62);
                  auVar50._0_8_ =
                       CONCAT44(-(uint)(auVar68._4_4_ <= 0.0),-(uint)(auVar68._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar50._8_4_ = -(uint)(auVar68._8_4_ <= 0.0) & 0x7fffffff;
                  auVar50._12_4_ = -(uint)(auVar68._12_4_ <= 0.0) & 0x7fffffff;
                  auVar55._4_4_ =
                       ~-(uint)(auVar68._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar69._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar66 < 0.70710677) & (uint)fVar46)) * 0.6931472 +
                               fVar67 + (((((((((fVar67 * 0.070376836 + -0.1151461) * fVar67 +
                                               0.116769984) * fVar67 + -0.12420141) * fVar67 +
                                             0.14249323) * fVar67 + -0.16668057) * fVar67 +
                                           0.20000714) * fVar67 + -0.24999994) * fVar67 + 0.3333333)
                                         * fVar67 + -0.5) * fVar67 * fVar67) * -2.0);
                  auVar55._0_4_ =
                       ~-(uint)(auVar68._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar69._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar64 < 0.70710677) & (uint)fVar45)) * 0.6931472 +
                               fVar65 + (((((((((fVar65 * 0.070376836 + -0.1151461) * fVar65 +
                                               0.116769984) * fVar65 + -0.12420141) * fVar65 +
                                             0.14249323) * fVar65 + -0.16668057) * fVar65 +
                                           0.20000714) * fVar65 + -0.24999994) * fVar65 + 0.3333333)
                                         * fVar65 + -0.5) * fVar65 * fVar65) * -2.0);
                  auVar55._8_4_ =
                       ~-(uint)(auVar68._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar69._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar58 < 0.70710677) & (uint)fVar47)) * 0.6931472 +
                               fVar60 + (((((((((fVar60 * 0.070376836 + -0.1151461) * fVar60 +
                                               0.116769984) * fVar60 + -0.12420141) * fVar60 +
                                             0.14249323) * fVar60 + -0.16668057) * fVar60 +
                                           0.20000714) * fVar60 + -0.24999994) * fVar60 + 0.3333333)
                                         * fVar60 + -0.5) * fVar60 * fVar60) * -2.0);
                  auVar55._12_4_ =
                       ~-(uint)(auVar68._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar69._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar62 < 0.70710677) & (uint)fVar48)) * 0.6931472 +
                               fVar63 + (((((((((fVar63 * 0.070376836 + -0.1151461) * fVar63 +
                                               0.116769984) * fVar63 + -0.12420141) * fVar63 +
                                             0.14249323) * fVar63 + -0.16668057) * fVar63 +
                                           0.20000714) * fVar63 + -0.24999994) * fVar63 + 0.3333333)
                                         * fVar63 + -0.5) * fVar63 * fVar63) * -2.0);
                  auVar55 = minps(auVar50 | auVar55,auVar16);
                  auVar55 = maxps(auVar55,auVar17);
                  fVar64 = auVar55._0_4_ * 1.442695 + 0.5;
                  fVar65 = auVar55._4_4_ * 1.442695 + 0.5;
                  fVar66 = auVar55._8_4_ * 1.442695 + 0.5;
                  fVar67 = auVar55._12_4_ * 1.442695 + 0.5;
                  fVar58 = (float)(int)fVar64;
                  fVar60 = (float)(int)fVar65;
                  fVar62 = (float)(int)fVar66;
                  fVar63 = (float)(int)fVar67;
                  fVar58 = fVar58 - (float)(-(uint)(fVar64 < fVar58) & (uint)fVar45);
                  fVar60 = fVar60 - (float)(-(uint)(fVar65 < fVar60) & (uint)fVar46);
                  fVar62 = fVar62 - (float)(-(uint)(fVar66 < fVar62) & (uint)fVar47);
                  fVar63 = fVar63 - (float)(-(uint)(fVar67 < fVar63) & (uint)fVar48);
                  fVar64 = auVar55._0_4_ - fVar58 * 0.6931472;
                  fVar65 = auVar55._4_4_ - fVar60 * 0.6931472;
                  fVar66 = auVar55._8_4_ - fVar62 * 0.6931472;
                  fVar67 = auVar55._12_4_ - fVar63 * 0.6931472;
                  auVar51._0_4_ =
                       fVar64 + fVar45 +
                       (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) * fVar64
                         + 0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) * fVar64 * fVar64;
                  auVar51._4_4_ =
                       fVar65 + fVar46 +
                       (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) * fVar65
                         + 0.041665796) * fVar65 + 0.16666666) * fVar65 + 0.5) * fVar65 * fVar65;
                  auVar51._8_4_ =
                       fVar66 + fVar47 +
                       (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66
                         + 0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * fVar66 * fVar66;
                  auVar51._12_4_ =
                       fVar67 + fVar48 +
                       (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67
                         + 0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67;
                  fVar58 = (float)((int)fVar58 * 0x800000 + (int)fVar45) * auVar51._0_4_ + fVar45;
                  fVar60 = (float)((int)fVar60 * 0x800000 + (int)fVar46) * auVar51._4_4_ + fVar46;
                  fVar62 = (float)((int)fVar62 * 0x800000 + (int)fVar47) * auVar51._8_4_ + fVar47;
                  fVar63 = (float)((int)fVar63 * 0x800000 + (int)fVar48) * auVar51._12_4_ + fVar48;
                  auVar3._4_4_ = fVar60;
                  auVar3._0_4_ = fVar58;
                  auVar3._8_4_ = fVar62;
                  auVar3._12_4_ = fVar63;
                  auVar55 = rcpps(auVar51,auVar3);
                  fVar64 = auVar55._0_4_;
                  fVar65 = auVar55._4_4_;
                  fVar66 = auVar55._8_4_;
                  fVar67 = auVar55._12_4_;
                  auVar69._0_4_ =
                       fVar49 * (fVar64 + fVar64 + -1.0 +
                                (2.0 - fVar58 * (fVar64 + fVar64)) * fVar64);
                  auVar69._4_4_ =
                       fVar59 * (fVar65 + fVar65 + -1.0 +
                                (2.0 - fVar60 * (fVar65 + fVar65)) * fVar65);
                  auVar69._8_4_ =
                       fVar56 * (fVar66 + fVar66 + -1.0 +
                                (2.0 - fVar62 * (fVar66 + fVar66)) * fVar66);
                  auVar69._12_4_ =
                       fVar61 * (fVar67 + fVar67 + -1.0 +
                                (2.0 - fVar63 * (fVar67 + fVar67)) * fVar67);
                  break;
                case 6:
                  fVar64 = **(float **)(&this->field_0x120 + (long)p_Var27);
                  fVar65 = (*(float **)(&this->field_0x120 + (long)p_Var27))[1];
                  auVar54._0_4_ = fVar64 * fVar49 + fVar65;
                  auVar54._4_4_ = fVar64 * fVar59 + fVar65;
                  auVar54._8_4_ = fVar64 * fVar56 + fVar65;
                  auVar54._12_4_ = fVar64 * fVar61 + fVar65;
                  auVar55 = maxps(auVar54,auVar55);
                  auVar55 = minps(auVar55,auVar18);
                  auVar69._0_4_ = fVar49 * auVar55._0_4_;
                  auVar69._4_4_ = fVar59 * auVar55._4_4_;
                  auVar69._8_4_ = fVar56 * auVar55._8_4_;
                  auVar69._12_4_ = fVar61 * auVar55._12_4_;
                }
                *pauVar39 = auVar69;
                pauVar39 = pauVar39 + 1;
                iVar30 = iVar30 + 1;
                iVar20 = iVar20 + 1;
              } while (iVar30 != iVar37);
            }
            fVar49 = (float)((int)local_138 + 1);
          } while ((float)((int)local_138 + 1) != _h);
        }
        local_240 = local_240 + 1;
      } while (local_240 != uVar25);
    }
LAB_0045ba0c:
    pMVar19 = local_198;
    DeconvolutionDepthWise::cut_padding
              ((DeconvolutionDepthWise *)
               ((long)&this->_vptr_DeconvolutionDepthWise_x86 +
               (long)this->_vptr_DeconvolutionDepthWise_x86[-3]),&local_238,local_198,opt);
    if ((pMVar19->data != (void *)0x0) && (iVar21 = 0, (long)pMVar19->c * pMVar19->cstep != 0))
    goto LAB_0045ba99;
  }
  else {
    uVar25 = iVar20 / iVar21;
    uVar26 = *(int *)(&this->field_0xd0 + (long)p_Var27) / iVar21;
    local_2b0 = 1;
    uVar36 = 1;
    if (opt->use_packing_layout == true) {
      local_2b0 = (uint)((uVar25 & 3) == 0) * 3 + 1;
      uVar36 = (ulong)((uint)((uVar26 & 3) == 0) * 3 + 1);
    }
    local_180.data = bottom_blob->data;
    local_180.refcount = bottom_blob->refcount;
    local_180.elemsize = bottom_blob->elemsize;
    local_180.elempack = bottom_blob->elempack;
    local_180.allocator = bottom_blob->allocator;
    local_180.dims = bottom_blob->dims;
    local_180.w = bottom_blob->w;
    local_180.h = bottom_blob->h;
    local_180.d = bottom_blob->d;
    local_180.c = bottom_blob->c;
    local_180.cstep = bottom_blob->cstep;
    if (local_180.refcount != (int *)0x0) {
      LOCK();
      *local_180.refcount = *local_180.refcount + 1;
      UNLOCK();
    }
    if (local_2b0 < iVar4) {
      local_1e8.data = *(void **)opt;
      local_1e8.elemsize = (size_t)opt->workspace_allocator;
      local_1e8.elempack = opt->openmp_blocktime;
      local_1e8._28_1_ = opt->use_winograd_convolution;
      local_1e8._29_1_ = opt->use_sgemm_convolution;
      local_1e8._30_1_ = opt->use_int8_inference;
      local_1e8._31_1_ = opt->use_vulkan_compute;
      local_1e8.allocator = *(Allocator **)&opt->use_bf16_storage;
      local_1e8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
      local_1e8._48_8_ = *(undefined8 *)&opt->flush_denormals;
      local_1e8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
      local_1e8.refcount = (int *)opt->workspace_allocator;
      convert_packing(bottom_blob,&local_180,local_2b0,(Option *)&local_1e8);
    }
    local_1e8.refcount = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
    local_1e8.data = local_238.data;
    local_1e8.elemsize = CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
    local_1e8.elempack = local_238.elempack;
    local_1e8.allocator = local_238.allocator;
    local_1e8.w = local_238.w;
    local_1e8.dims = local_238.dims;
    local_1e8.d = local_238.d;
    local_1e8.h = local_238.h;
    local_1e8.c = local_238.c;
    local_1e8.cstep = local_238.cstep;
    if (local_1e8.refcount != (int *)0x0) {
      LOCK();
      *local_1e8.refcount = *local_1e8.refcount + 1;
      UNLOCK();
    }
    pp_Var28 = this->_vptr_DeconvolutionDepthWise_x86;
    _elempack = (uint)uVar36;
    if (uVar35 <= _elempack) {
LAB_0045b210:
      if (0 < *(int *)(&this->field_0x114 + (long)pp_Var28[-3])) {
        iVar44 = 0;
        iVar43 = 0;
        lVar31 = 0;
        do {
          local_c0 = (void *)((long)(iVar44 / local_2b0) * local_180.cstep * local_180.elemsize +
                             (long)local_180.data);
          local_b8 = (int *)0x0;
          local_b0 = local_180.elemsize;
          local_a8 = local_180.elempack;
          local_a0 = local_180.allocator;
          local_94 = local_180.w;
          local_90 = local_180.h;
          local_8c = local_180.d;
          local_80 = ((long)local_180.d * local_180.elemsize * (long)local_180.h * (long)local_180.w
                      + 0xf & 0xfffffffffffffff0) / local_180.elemsize;
          local_98 = local_180.dims;
          local_108 = (void *)((long)(iVar43 / (int)_elempack) * local_1e8.cstep *
                               local_1e8.elemsize + (long)local_1e8.data);
          local_100 = (int *)0x0;
          local_f8 = local_1e8.elemsize;
          local_f0 = local_1e8.elempack;
          local_e8 = local_1e8.allocator;
          local_dc = local_1e8.w;
          local_d8 = local_1e8.h;
          local_d4 = local_1e8.d;
          local_c8 = ((long)local_1e8.d * local_1e8.elemsize * (long)local_1e8.h * (long)local_1e8.w
                      + 0xf & 0xfffffffffffffff0) / local_1e8.elemsize;
          local_e0 = local_1e8.dims;
          pLVar9 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar31];
          local_78._0_1_ = opt->lightmode;
          local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
          local_78._4_4_ = opt->num_threads;
          local_68 = *(undefined4 *)&opt->workspace_allocator;
          uStack_64 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
          iStack_60 = opt->openmp_blocktime;
          uStack_5c._0_1_ = opt->use_winograd_convolution;
          uStack_5c._1_1_ = opt->use_sgemm_convolution;
          uStack_5c._2_1_ = opt->use_int8_inference;
          uStack_5c._3_1_ = opt->use_vulkan_compute;
          local_58._0_1_ = opt->use_bf16_storage;
          local_58._1_1_ = opt->use_fp16_packed;
          local_58._2_1_ = opt->use_fp16_storage;
          local_58._3_1_ = opt->use_fp16_arithmetic;
          local_58._4_1_ = opt->use_int8_packed;
          local_58._5_1_ = opt->use_int8_storage;
          local_58._6_1_ = opt->use_int8_arithmetic;
          local_58._7_1_ = opt->use_packing_layout;
          uStack_50._0_1_ = opt->use_shader_pack8;
          uStack_50._1_1_ = opt->use_subgroup_basic;
          uStack_50._2_1_ = opt->use_subgroup_vote;
          uStack_50._3_1_ = opt->use_subgroup_ballot;
          uStack_50._4_1_ = opt->use_subgroup_shuffle;
          uStack_50._5_1_ = opt->use_image_storage;
          uStack_50._6_1_ = opt->use_tensor_storage;
          uStack_50._7_1_ = opt->use_reserved_0;
          local_48 = opt->flush_denormals;
          uStack_44._0_1_ = opt->use_local_pool_allocator;
          uStack_44._1_1_ = opt->use_shader_local_memory;
          uStack_44._2_1_ = opt->use_cooperative_matrix;
          uStack_44._3_1_ = opt->use_winograd23_convolution;
          uStack_40._0_1_ = opt->use_winograd43_convolution;
          uStack_40._1_1_ = opt->use_winograd63_convolution;
          uStack_40._2_1_ = opt->use_reserved_6;
          uStack_40._3_1_ = opt->use_reserved_7;
          uStack_3c._0_1_ = opt->use_reserved_8;
          uStack_3c._1_1_ = opt->use_reserved_9;
          uStack_3c._2_1_ = opt->use_reserved_10;
          uStack_3c._3_1_ = opt->use_reserved_11;
          pAStack_70 = local_1e8.allocator;
          local_d0 = (int)uVar26 / (int)_elempack;
          local_88 = (int)uVar25 / local_2b0;
          (*pLVar9->_vptr_Layer[7])(pLVar9,&local_c0,&local_108,&local_78);
          if (local_100 != (int *)0x0) {
            LOCK();
            *local_100 = *local_100 + -1;
            UNLOCK();
            if (*local_100 == 0) {
              if (local_e8 == (Allocator *)0x0) {
                if (local_108 != (void *)0x0) {
                  free(local_108);
                }
              }
              else {
                (*local_e8->_vptr_Allocator[3])();
              }
            }
          }
          if (local_b8 != (int *)0x0) {
            LOCK();
            *local_b8 = *local_b8 + -1;
            UNLOCK();
            if (*local_b8 == 0) {
              if (local_a0 == (Allocator *)0x0) {
                if (local_c0 != (void *)0x0) {
                  free(local_c0);
                }
              }
              else {
                (*local_a0->_vptr_Allocator[3])();
              }
            }
          }
          lVar31 = lVar31 + 1;
          iVar43 = iVar43 + uVar26;
          iVar44 = iVar44 + uVar25;
        } while (lVar31 < *(int *)(&this->field_0x114 +
                                  (long)this->_vptr_DeconvolutionDepthWise_x86[-3]));
      }
      if (_elempack < uVar35) {
        convert_packing(&local_1e8,&local_238,uVar35,opt);
      }
      else {
        if (local_1e8.refcount != (int *)0x0) {
          LOCK();
          *local_1e8.refcount = *local_1e8.refcount + 1;
          UNLOCK();
        }
        piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_238.allocator == (Allocator *)0x0) {
              if (local_238.data != (void *)0x0) {
                free(local_238.data);
              }
            }
            else {
              (*(local_238.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_238.data = local_1e8.data;
        local_238.refcount._0_4_ = SUB84(local_1e8.refcount,0);
        local_238.refcount._4_4_ = (undefined4)((ulong)local_1e8.refcount >> 0x20);
        local_238.elemsize._0_4_ = (undefined4)local_1e8.elemsize;
        local_238.elemsize._4_4_ = (undefined4)(local_1e8.elemsize >> 0x20);
        local_238.elempack = local_1e8.elempack;
        local_238.allocator = local_1e8.allocator;
        local_238.dims = local_1e8.dims;
        local_238.w = local_1e8.w;
        local_238.h = local_1e8.h;
        local_238.d = local_1e8.d;
        local_238.c = local_1e8.c;
        local_238.cstep = local_1e8.cstep;
      }
      if (local_1e8.refcount != (int *)0x0) {
        LOCK();
        *local_1e8.refcount = *local_1e8.refcount + -1;
        UNLOCK();
        if (*local_1e8.refcount == 0) {
          if (local_1e8.allocator == (Allocator *)0x0) {
            if (local_1e8.data != (void *)0x0) {
              free(local_1e8.data);
            }
          }
          else {
            (*(local_1e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_180.refcount != (int *)0x0) {
        LOCK();
        *local_180.refcount = *local_180.refcount + -1;
        UNLOCK();
        if (*local_180.refcount == 0) {
          if (local_180.allocator == (Allocator *)0x0) {
            if (local_180.data != (void *)0x0) {
              free(local_180.data);
            }
          }
          else {
            (*(local_180.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_0045ba0c;
    }
    Mat::create(&local_1e8,iVar37,(int)_h,
                *(int *)(&this->field_0xd0 + (long)pp_Var28[-3]) / (int)_elempack,
                uVar36 * (sVar40 / uVar35),_elempack,opt->workspace_allocator);
    if ((local_1e8.data != (void *)0x0) && ((long)local_1e8.c * local_1e8.cstep != 0)) {
      pp_Var28 = this->_vptr_DeconvolutionDepthWise_x86;
      goto LAB_0045b210;
    }
    if (local_1e8.refcount != (int *)0x0) {
      LOCK();
      *local_1e8.refcount = *local_1e8.refcount + -1;
      UNLOCK();
      if (*local_1e8.refcount == 0) {
        if (local_1e8.allocator == (Allocator *)0x0) {
          if (local_1e8.data != (void *)0x0) {
            free(local_1e8.data);
          }
        }
        else {
          (*(local_1e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (local_180.refcount != (int *)0x0) {
      LOCK();
      *local_180.refcount = *local_180.refcount + -1;
      UNLOCK();
      if (*local_180.refcount == 0) {
        if (local_180.allocator == (Allocator *)0x0) {
          if (local_180.data != (void *)0x0) {
            free(local_180.data);
          }
        }
        else {
          (*(local_180.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  iVar21 = -100;
LAB_0045ba99:
  piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar21;
}

Assistant:

int DeconvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}